

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

GaoVectorSet * __thiscall
AlphaVectorPlanning::BackProjectFull
          (GaoVectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *v)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  PlanningUnitDecPOMDPDiscrete *pPVar6;
  ulong uVar7;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  E *this_01;
  ulong uVar8;
  ulong uVar9;
  ulong size1;
  long lVar10;
  ulong uVar11;
  result_type rVar12;
  string local_e8;
  VectorSet v1;
  matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mV;
  vector<int,_std::allocator<int>_> duplicates;
  VectorSet vv;
  
  pPVar6 = this->_m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->_m_puShared).px;
  }
  uVar3 = (**(code **)((long)*(pPVar6->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar6 = this->_m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->_m_puShared).px;
  }
  uVar4 = (**(code **)((long)*(pPVar6->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  pPVar6 = this->_m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->_m_puShared).px;
  }
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar6->super_PlanningUnitMADPDiscrete);
  size1 = (ulong)(uint)v->size1_;
  pPVar6 = this->_m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->_m_puShared).px;
  }
  if (size1 == 0) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "AlphaVectorPlanning::BackProjectFull attempting to backproject empty value function");
    __cxa_throw(this_01,&E::typeinfo,E::~E);
  }
  bVar1 = (pPVar6->super_PlanningUnitMADPDiscrete)._m_params._m_eventObservability;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v1,"BackProjectFull",(allocator<char> *)&vv);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)&v1);
  std::__cxx11::string::~string((string *)&v1);
  vv._0_16_ = boost::detail::multi_array::extent_gen<0UL>::operator[]
                        ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,uVar3 & 0xffffffff
                        );
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<2UL> *)&v1,(extent_gen<1UL> *)&vv,uVar4 & 0xffffffff);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(__return_storage_ptr__,(extent_gen<2UL> *)&v1);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&v1,size1,sVar5 & 0xffffffff);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&vv,v);
  GetDuplicateIndices(&duplicates,v);
  for (uVar11 = 0; uVar11 != (uVar3 & 0xffffffff); uVar11 = uVar11 + 1) {
    for (uVar9 = 0; uVar9 != (uVar4 & 0xffffffff); uVar9 = uVar9 + 1) {
      lVar10 = 0;
      for (uVar7 = 0; uVar7 != size1; uVar7 = uVar7 + 1) {
        iVar2 = duplicates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if ((long)iVar2 == -1) {
          mV.data_.e_ = &vv;
          mV.i_ = uVar7;
          for (uVar8 = 0; (sVar5 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
            local_e8._M_dataplus._M_p =
                 (pointer)(this->_m_T).
                          super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11];
            local_e8._M_string_length = uVar8;
            if (bVar1 == false) {
              local_e8.field_2._M_allocated_capacity =
                   (size_type)
                   (this->_m_O).
                   super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11];
              local_e8.field_2._8_8_ = uVar9;
              rVar12 = boost::numeric::ublas::
                       inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_column<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                                 ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                                   *)&local_e8,
                                  (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                                   *)&mV);
            }
            else {
              local_e8.field_2._M_allocated_capacity =
                   *(undefined8 *)
                    (*(long *)&(this->_m_Oe).
                               super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar11].
                               super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data + uVar9 * 8);
              local_e8.field_2._8_8_ = uVar8;
              rVar12 = boost::numeric::ublas::
                       inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                                 ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                                   *)&local_e8,
                                  (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                                   *)&mV);
            }
            *(result_type *)((long)v1.data_.data_ + uVar8 * 8 + v1.size2_ * lVar10) = rVar12;
          }
        }
        else {
          for (uVar8 = 0; (sVar5 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
            *(double *)((long)v1.data_.data_ + uVar8 * 8 + v1.size2_ * lVar10) =
                 v1.data_.data_[(long)iVar2 * v1.size2_ + uVar8];
          }
        }
        lVar10 = lVar10 + 8;
      }
      this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)operator_new(0x28);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::matrix(this_00,&v1);
      (__return_storage_ptr__->
      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      ).
      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
      .base_[(__return_storage_ptr__->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .origin_offset_ +
             (__return_storage_ptr__->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .stride_list_.elems[0] * uVar11 +
             (__return_storage_ptr__->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .stride_list_.elems[1] * uVar9] = this_00;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"BackProjectFull",(allocator<char> *)&mV);
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&duplicates.super__Vector_base<int,_std::allocator<int>_>);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&vv.data_);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&v1.data_);
  return __return_storage_ptr__;
}

Assistant:

GaoVectorSet AlphaVectorPlanning::BackProjectFull(const VectorSet &v) const
{
    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates(),
        nrInV=v.size1();
    bool isEventDriven = GetPU()->GetParams().GetEventObservability();
    if(nrInV==0)
        throw(E("AlphaVectorPlanning::BackProjectFull attempting to backproject empty value function"));

#if DEBUG_AlphaVectorPlanning_BackProject
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BackProjectFull");
    
    GaoVectorSet G(boost::extents[nrA][nrO]);
    VectorSet v1(nrInV,nrS);
#if AlphaVectorPlanning_UseUBLASinBackProject
    VectorSet vv=v;
#endif
    double x;

#if AlphaVectorPlanning_CheckForDuplicates
    vector<int> duplicates=GetDuplicateIndices(v);
#else
    vector<int> duplicates(nrInV,-1);
#endif
    int dup;

    using namespace boost::numeric::ublas;

    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            for(unsigned int k=0;k!=nrInV;k++)
            {
                if(duplicates[k]==-1)
                {
#if AlphaVectorPlanning_UseUBLASinBackProject
                    const matrix_row<VectorSet> mV(vv,k);
#endif
                    for(unsigned int s=0;s!=nrS;s++)
                    {
#if AlphaVectorPlanning_UseUBLASinBackProject
                        matrix_row<const TransitionModelMapping::Matrix>
                            mT(*_m_T[a],s);
                        if(isEventDriven)
                        {
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            matrix_row<const ObservationModelMapping::Matrix> mO(*_m_Oe[a][o],s);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }else{
                            matrix_column<const ObservationModelMapping::Matrix> mO(*_m_O[a],o);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }
#if AlphaVectorPlanning_VerifyUBLASinBackProject
                        double x1=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x1+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
                        if(abs(x-x1)>1e-14)
                        {
                            cerr << x << " " << x1 << " " << x-x1 << endl;
                            abort();
                        }
#endif
#else // AlphaVectorPlanning_UseUBLASinBackProject
                        x=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
#endif
                        v1(k,s)=x;
                    }
                }
                else
                {
                    dup=duplicates[k];
                    for(unsigned int s=0;s!=nrS;s++)
                        v1(k,s)=v1(dup,s);
                }
            }
            G[a][o]=new VectorSet(v1);
        }

    StopTimer("BackProjectFull");

#if DEBUG_AlphaVectorPlanning_BackProjectFullPrintout
    cout << "BackProjectFull of:" << endl;
    for(unsigned int k=0;k!=nrInV;k++)
    {
        for(unsigned int s=0;s!=nrS;s++)
            cout << v(k,s) << " ";
        cout << endl;
    }

    VectorSet *VS;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            cout << "Gao a " << a << " o " << o << endl;

            VS=G[a][o];
            for(unsigned int k=0;k!=VS->size1();k++)
            {
                for(unsigned int s=0;s!=VS->size2();s++)
                    cout << (*VS)(k,s) << " ";
                cout << endl;
            }
        }
#endif

#if DEBUG_AlphaVectorPlanning_BackProjectFullSanityCheck
    double maxInV=-DBL_MAX;
    for(unsigned int k=0;k!=nrInV;k++)
        for(unsigned int s=0;s!=nrS;s++)
            maxInV=max(maxInV,v(k,s));

    double maxInGao=-DBL_MAX;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int k=0;k!=nrInV;k++)
                for(unsigned int s=0;s!=nrS;s++)
                    maxInGao=max(maxInGao,(*G[a][o])(k,s));

    if(maxInGao>maxInV)
    {
        cout << "Max value in V is " << maxInV << ", max in Gao is "
             << maxInGao << endl;
        abort();
    }
#endif

#if DEBUG_AlphaVectorPlanning_BackProject
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorPlanning::BackProject done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
    // test results on 22-12-2006
    // using dense Matrix is about 2 faster than calling the Get*Prob()
    // using sparse Matrix is almost 3 times slower then dense Matrix
#endif
    return(G);
}